

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaAnalytic_mels.c
# Opt level: O0

int fres(sunrealtype t,N_Vector yy,N_Vector yp,N_Vector rr,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  double dVar5;
  sunrealtype TWO;
  sunrealtype ONE;
  sunrealtype x1p;
  sunrealtype x2;
  sunrealtype x1;
  sunrealtype alpha;
  sunrealtype *rdata;
  
  dVar5 = *in_RCX;
  dVar1 = **(double **)(*in_RDI + 0x10);
  dVar2 = *(double *)(*(long *)(*in_RDI + 0x10) + 8);
  dVar3 = **(double **)(*in_RSI + 0x10);
  dVar4 = exp(in_XMM0_Qa);
  **(double **)(*in_RDX + 0x10) =
       (dVar4 * 2.0 + (dVar5 - 1.0) * dVar2 + ((1.0 - dVar5) / (in_XMM0_Qa - 2.0)) * dVar1 + -dVar1)
       - dVar3;
  dVar5 = exp(in_XMM0_Qa);
  *(double *)(*(long *)(*in_RDX + 0x10) + 8) =
       (in_XMM0_Qa + 2.0) * dVar1 + -((in_XMM0_Qa + 2.0) * dVar5);
  return 0;
}

Assistant:

int fres(sunrealtype t, N_Vector yy, N_Vector yp, N_Vector rr, void* user_data)
{
  sunrealtype* rdata = (sunrealtype*)user_data; /* cast user_data to sunrealtype */
  sunrealtype alpha = rdata[0]; /* set shortcut for stiffness parameter */
  sunrealtype x1    = NV_Ith_S(yy, 0); /* access current solution values */
  sunrealtype x2    = NV_Ith_S(yy, 1);
  sunrealtype x1p   = NV_Ith_S(yp, 0); /* access current derivative values */
  sunrealtype ONE   = SUN_RCONST(1.0);
  sunrealtype TWO   = SUN_RCONST(2.0);

  NV_Ith_S(rr, 0) = (ONE - alpha) / (t - TWO) * x1 - x1 + (alpha - ONE) * x2 +
                    TWO * exp(t) - x1p;
  NV_Ith_S(rr, 1) = (t + TWO) * x1 - (t + TWO) * SUNRexp(t);

  return (0);
}